

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Maybe<kj::HashMap<capnp::ClientHook_*,_unsigned_int>::Entry_&> __thiscall
kj::
Table<kj::HashMap<capnp::ClientHook*,unsigned_int>::Entry,kj::HashIndex<kj::HashMap<capnp::ClientHook*,unsigned_int>::Callbacks>>
::find<0ul,capnp::ClientHook*&>
          (Table<kj::HashMap<capnp::ClientHook*,unsigned_int>::Entry,kj::HashIndex<kj::HashMap<capnp::ClientHook*,unsigned_int>::Callbacks>>
           *this,ClientHook **params)

{
  ClientHook *pCVar1;
  ArrayPtr<kj::HashMap<capnp::ClientHook_*,_unsigned_int>::Entry> table;
  HashIndex<kj::HashMap<capnp::ClientHook*,unsigned_int>::Callbacks> local_28 [8];
  long local_20;
  
  table.ptr = (Entry *)(params + 4);
  table.size_ = (size_t)*params;
  HashIndex<kj::HashMap<capnp::ClientHook*,unsigned_int>::Callbacks>::
  find<kj::HashMap<capnp::ClientHook*,unsigned_int>::Entry,capnp::ClientHook*&>
            (local_28,table,(ClientHook **)((long)params[1] - (long)*params >> 4));
  if (local_28[0] == (HashIndex<kj::HashMap<capnp::ClientHook*,unsigned_int>::Callbacks>)0x1) {
    pCVar1 = *params + local_20;
  }
  else {
    pCVar1 = (ClientHook *)0x0;
  }
  *(ClientHook **)this = pCVar1;
  return (Maybe<kj::HashMap<capnp::ClientHook_*,_unsigned_int>::Entry_&>)(Entry *)this;
}

Assistant:

kj::Maybe<Row&> Table<Row, Indexes...>::find(Params&&... params) {
  KJ_IF_SOME(pos, get<index>(indexes).find(rows.asPtr(), kj::fwd<Params>(params)...)) {
    return rows[pos];
  } else {
    return kj::none;
  }
}